

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCCompatible.cpp
# Opt level: O2

unique_ptr<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>_>
PCCompatible::Machine::PCCompatible(Target *target,ROMFetcher *rom_fetcher)

{
  int iVar1;
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  *__args_1;
  _func_int **local_20;
  
  __args_1 = (function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
              *)__dynamic_cast(rom_fetcher,&Analyser::Static::Target::typeinfo,
                               &Analyser::Static::PCCompatible::Target::typeinfo,0);
  iVar1 = *(int *)((long)&__args_1[4].super__Function_base._M_functor + 8);
  if (iVar1 == 1) {
    std::
    make_unique<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)1>,Analyser::Static::PCCompatible::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)&stack0xffffffffffffffe0,__args_1);
  }
  else {
    if (iVar1 != 0) {
      target->_vptr_Target = (_func_int **)0x0;
      return (__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
              )(__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
                )target;
    }
    std::
    make_unique<PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>,Analyser::Static::PCCompatible::Target_const&,std::function<std::map<ROM::Name,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<ROM::Name>,std::allocator<std::pair<ROM::Name_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>(ROM::Request_const&)>const&>
              ((Target *)&stack0xffffffffffffffe0,__args_1);
  }
  target->_vptr_Target = local_20;
  return (__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
          )(__uniq_ptr_data<PCCompatible::Machine,_std::default_delete<PCCompatible::Machine>,_true,_true>
            )target;
}

Assistant:

std::unique_ptr<Machine> Machine::PCCompatible(const Analyser::Static::Target *target, const ROMMachine::ROMFetcher &rom_fetcher) {
	const Target *const pc_target = dynamic_cast<const Target *>(target);

	switch(pc_target->adaptor) {
		case Target::VideoAdaptor::MDA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::MDA>>(*pc_target, rom_fetcher);
		case Target::VideoAdaptor::CGA:	return std::make_unique<PCCompatible::ConcreteMachine<Target::VideoAdaptor::CGA>>(*pc_target, rom_fetcher);
		default: return nullptr;
	}
}